

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

float __thiscall sf::Font::getKerning(Font *this,Uint32 first,Uint32 second,uint characterSize)

{
  bool bVar1;
  undefined4 uVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  FT_Vector kerning;
  FT_UInt index2;
  FT_UInt index1;
  FT_Face_conflict face;
  long local_40 [2];
  undefined4 local_30;
  uint in_stack_ffffffffffffffd4;
  Font *this_00;
  float local_4;
  
  if ((in_ESI == 0) || (in_EDX == 0)) {
    local_4 = 0.0;
  }
  else {
    this_00 = *(Font **)(in_RDI + 8);
    if (((this_00 == (Font *)0x0) || (((ulong)this_00->m_streamRec & 0x40) == 0)) ||
       (bVar1 = setCurrentSize(this_00,in_stack_ffffffffffffffd4), !bVar1)) {
      local_4 = 0.0;
    }
    else {
      uVar2 = FT_Get_Char_Index(this_00,in_ESI);
      local_30 = FT_Get_Char_Index(this_00,in_EDX);
      FT_Get_Kerning(this_00,uVar2,local_30,0,local_40);
      if (((ulong)this_00->m_streamRec & 1) == 0) {
        local_4 = (float)local_40[0];
      }
      else {
        local_4 = (float)local_40[0] / 64.0;
      }
    }
  }
  return local_4;
}

Assistant:

float Font::getKerning(Uint32 first, Uint32 second, unsigned int characterSize) const
{
    // Special case where first or second is 0 (null character)
    if (first == 0 || second == 0)
        return 0.f;

    FT_Face face = static_cast<FT_Face>(m_face);

    if (face && FT_HAS_KERNING(face) && setCurrentSize(characterSize))
    {
        // Convert the characters to indices
        FT_UInt index1 = FT_Get_Char_Index(face, first);
        FT_UInt index2 = FT_Get_Char_Index(face, second);

        // Get the kerning vector
        FT_Vector kerning;
        FT_Get_Kerning(face, index1, index2, FT_KERNING_DEFAULT, &kerning);

        // X advance is already in pixels for bitmap fonts
        if (!FT_IS_SCALABLE(face))
            return static_cast<float>(kerning.x);

        // Return the X advance
        return static_cast<float>(kerning.x) / static_cast<float>(1 << 6);
    }
    else
    {
        // Invalid font, or no kerning
        return 0.f;
    }
}